

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  bool *pbVar5;
  int32_t *piVar6;
  char *pcVar7;
  size_t sVar8;
  lbool *plVar9;
  char *pcVar10;
  char **in_RSI;
  int in_EDI;
  ushort in_FPUControlWord;
  OutOfMemoryException *anon_var_0;
  int i_1;
  int i;
  lbool ret;
  vec<Minisat::Lit> dummy;
  double simplified_time;
  double parsed_time;
  FILE *res;
  FILE *in;
  rlimit rl_1;
  rlim_t new_mem_lim;
  rlimit rl;
  double initial_time;
  SimpSolver S;
  StringOption pcs_file;
  StringOption drup_file;
  BoolOption drup;
  IntOption mem_lim;
  IntOption cpu_lim;
  StringOption dimacs;
  BoolOption s_model;
  BoolOption pre;
  IntOption verb;
  fpu_control_t newcw;
  fpu_control_t oldcw;
  SimpSolver *in_stack_000fe658;
  FILE *in_stack_000fe660;
  lbool *this;
  StringOption *this_00;
  undefined4 in_stack_ffffffffffffe658;
  int32_t in_stack_ffffffffffffe65c;
  undefined7 in_stack_ffffffffffffe660;
  undefined1 in_stack_ffffffffffffe667;
  undefined4 in_stack_ffffffffffffe668;
  undefined1 in_stack_ffffffffffffe66c;
  undefined1 in_stack_ffffffffffffe66d;
  undefined1 in_stack_ffffffffffffe66e;
  uchar in_stack_ffffffffffffe66f;
  Solver *in_stack_ffffffffffffe670;
  FILE *__stream;
  IntOption *in_stack_ffffffffffffe678;
  IntRange in_stack_ffffffffffffe680;
  undefined7 in_stack_ffffffffffffe688;
  undefined1 in_stack_ffffffffffffe68f;
  BoolOption *in_stack_ffffffffffffe690;
  undefined4 in_stack_ffffffffffffe698;
  undefined4 in_stack_ffffffffffffe69c;
  undefined4 in_stack_ffffffffffffe6a0;
  undefined1 in_stack_ffffffffffffe6a4;
  undefined1 in_stack_ffffffffffffe6a5;
  undefined1 in_stack_ffffffffffffe6a6;
  undefined1 in_stack_ffffffffffffe6a7;
  undefined8 in_stack_ffffffffffffe6a8;
  undefined1 tunable;
  char *in_stack_ffffffffffffe6b0;
  undefined7 in_stack_ffffffffffffe6b8;
  undefined1 in_stack_ffffffffffffe6bf;
  char *in_stack_ffffffffffffe6c0;
  undefined4 in_stack_ffffffffffffe6c8;
  undefined4 in_stack_ffffffffffffe6cc;
  StringOption *in_stack_ffffffffffffe6d0;
  byte local_1923;
  Option *in_stack_ffffffffffffe6e0;
  FILE *local_18d8;
  char *local_18c8;
  FILE *local_18b8;
  char *local_1878;
  FILE *local_1868;
  lbool local_1805;
  lbool local_1804;
  lbool local_1803;
  lbool local_1802;
  lbool local_1801;
  int local_1800;
  lbool local_17fc;
  lbool local_17fb;
  lbool local_17fa;
  lbool local_17f9;
  int local_17f8;
  lbool local_17f4;
  lbool local_17f3;
  lbool local_17f2;
  lbool local_17f1;
  vec<Minisat::Lit> local_17f0;
  vec<Minisat::Lit> local_17e0;
  double local_17d0;
  double local_17c8;
  FILE *local_17c0;
  FILE *local_17b8;
  rlimit local_17b0;
  ulong local_17a0;
  rlimit local_1798;
  double local_1788;
  SimpSolver local_1780 [8];
  vec<Minisat::lbool> local_1778 [32];
  FILE *local_1758;
  int32_t local_174c;
  undefined1 local_387;
  BoolOption local_1e0;
  IntRange local_1a8;
  IntOption local_1a0;
  IntRange local_160;
  IntOption local_158 [2];
  BoolOption local_d8;
  BoolOption local_a0;
  IntRange local_68;
  IntOption local_60;
  ushort local_20;
  char **local_10;
  int local_8 [2];
  
  tunable = (undefined1)((ulong)in_stack_ffffffffffffe6a8 >> 0x38);
  local_8[1] = 0;
  local_10 = in_RSI;
  local_8[0] = in_EDI;
  Minisat::setUsageHelp
            (
            "USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n"
            );
  printf("c This is MergeSAT (simp).\n");
  local_20 = in_FPUControlWord & 0xfcff | 0x200;
  printf("c WARNING: for repeatability, setting FPU to use double precision\n");
  Minisat::IntRange::IntRange(&local_68,0,4);
  Minisat::IntOption::IntOption
            (in_stack_ffffffffffffe678,(char *)in_stack_ffffffffffffe670,
             (char *)CONCAT17(in_stack_ffffffffffffe66f,
                              CONCAT16(in_stack_ffffffffffffe66e,
                                       CONCAT15(in_stack_ffffffffffffe66d,
                                                CONCAT14(in_stack_ffffffffffffe66c,
                                                         in_stack_ffffffffffffe668)))),
             (char *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
             in_stack_ffffffffffffe65c,in_stack_ffffffffffffe680,
             SUB41((uint)in_stack_ffffffffffffe658 >> 0x18,0),
             (Option *)CONCAT44(in_stack_ffffffffffffe69c,in_stack_ffffffffffffe698));
  Minisat::BoolOption::BoolOption
            (in_stack_ffffffffffffe690,
             (char *)CONCAT17(in_stack_ffffffffffffe68f,in_stack_ffffffffffffe688),
             (char *)in_stack_ffffffffffffe680,(char *)in_stack_ffffffffffffe678,
             SUB81((ulong)in_stack_ffffffffffffe670 >> 0x38,0),
             SUB81((ulong)in_stack_ffffffffffffe670 >> 0x30,0),
             (Option *)
             CONCAT17(in_stack_ffffffffffffe6a7,
                      CONCAT16(in_stack_ffffffffffffe6a6,
                               CONCAT15(in_stack_ffffffffffffe6a5,
                                        CONCAT14(in_stack_ffffffffffffe6a4,in_stack_ffffffffffffe6a0
                                                )))));
  Minisat::BoolOption::BoolOption
            (in_stack_ffffffffffffe690,
             (char *)CONCAT17(in_stack_ffffffffffffe68f,in_stack_ffffffffffffe688),
             (char *)in_stack_ffffffffffffe680,(char *)in_stack_ffffffffffffe678,
             SUB81((ulong)in_stack_ffffffffffffe670 >> 0x38,0),
             SUB81((ulong)in_stack_ffffffffffffe670 >> 0x30,0),
             (Option *)
             CONCAT17(in_stack_ffffffffffffe6a7,
                      CONCAT16(in_stack_ffffffffffffe6a6,
                               CONCAT15(in_stack_ffffffffffffe6a5,
                                        CONCAT14(in_stack_ffffffffffffe6a4,in_stack_ffffffffffffe6a0
                                                )))));
  Minisat::StringOption::StringOption
            (in_stack_ffffffffffffe6d0,
             (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
             in_stack_ffffffffffffe6c0,
             (char *)CONCAT17(in_stack_ffffffffffffe6bf,in_stack_ffffffffffffe6b8),
             in_stack_ffffffffffffe6b0,(bool)tunable,in_stack_ffffffffffffe6e0);
  Minisat::IntRange::IntRange(&local_160,0,0x7fffffff);
  Minisat::IntOption::IntOption
            (in_stack_ffffffffffffe678,(char *)in_stack_ffffffffffffe670,
             (char *)CONCAT17(in_stack_ffffffffffffe66f,
                              CONCAT16(in_stack_ffffffffffffe66e,
                                       CONCAT15(in_stack_ffffffffffffe66d,
                                                CONCAT14(in_stack_ffffffffffffe66c,
                                                         in_stack_ffffffffffffe668)))),
             (char *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
             in_stack_ffffffffffffe65c,in_stack_ffffffffffffe680,
             SUB41((uint)in_stack_ffffffffffffe658 >> 0x18,0),
             (Option *)CONCAT44(in_stack_ffffffffffffe69c,in_stack_ffffffffffffe698));
  Minisat::IntRange::IntRange(&local_1a8,0,0x7fffffff);
  this_00 = (StringOption *)0x0;
  Minisat::IntOption::IntOption
            (in_stack_ffffffffffffe678,(char *)in_stack_ffffffffffffe670,
             (char *)CONCAT17(in_stack_ffffffffffffe66f,
                              CONCAT16(in_stack_ffffffffffffe66e,
                                       CONCAT15(in_stack_ffffffffffffe66d,
                                                CONCAT14(in_stack_ffffffffffffe66c,
                                                         in_stack_ffffffffffffe668)))),
             (char *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
             in_stack_ffffffffffffe65c,in_stack_ffffffffffffe680,
             SUB41((uint)in_stack_ffffffffffffe658 >> 0x18,0),
             (Option *)CONCAT44(in_stack_ffffffffffffe69c,in_stack_ffffffffffffe698));
  Minisat::BoolOption::BoolOption
            (in_stack_ffffffffffffe690,
             (char *)CONCAT17(in_stack_ffffffffffffe68f,in_stack_ffffffffffffe688),
             (char *)in_stack_ffffffffffffe680,(char *)in_stack_ffffffffffffe678,
             SUB81((ulong)in_stack_ffffffffffffe670 >> 0x38,0),
             SUB81((ulong)in_stack_ffffffffffffe670 >> 0x30,0),
             (Option *)
             CONCAT17(in_stack_ffffffffffffe6a7,
                      CONCAT16(in_stack_ffffffffffffe6a6,
                               CONCAT15(in_stack_ffffffffffffe6a5,
                                        CONCAT14(in_stack_ffffffffffffe6a4,in_stack_ffffffffffffe6a0
                                                )))));
  Minisat::StringOption::StringOption
            (in_stack_ffffffffffffe6d0,
             (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
             in_stack_ffffffffffffe6c0,
             (char *)CONCAT17(in_stack_ffffffffffffe6bf,in_stack_ffffffffffffe6b8),
             in_stack_ffffffffffffe6b0,(bool)tunable,in_stack_ffffffffffffe6e0);
  this = (lbool *)0x0;
  Minisat::StringOption::StringOption
            (in_stack_ffffffffffffe6d0,
             (char *)CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8),
             in_stack_ffffffffffffe6c0,
             (char *)CONCAT17(in_stack_ffffffffffffe6bf,in_stack_ffffffffffffe6b8),
             in_stack_ffffffffffffe6b0,(bool)tunable,in_stack_ffffffffffffe6e0);
  Minisat::parseOptions(local_8,local_10,true);
  bVar1 = Minisat::StringOption::is_empty(this_00);
  if (!bVar1) {
    Minisat::StringOption::operator_cast_to_char_(this_00);
    print_pcs_file((char *)this_00);
  }
  Minisat::SimpSolver::SimpSolver(local_1780);
  local_1788 = Minisat::cpuTime();
  pbVar5 = Minisat::BoolOption::operator_cast_to_bool_(&local_a0);
  if ((*pbVar5 & 1U) == 0) {
    Minisat::SimpSolver::eliminate(SUB81(local_1780,0));
  }
  local_387 = 1;
  piVar6 = Minisat::IntOption::operator_cast_to_int_(&local_60);
  local_174c = *piVar6;
  local_1758 = (FILE *)0x0;
  pbVar5 = Minisat::BoolOption::operator_cast_to_bool_(&local_1e0);
  if ((*pbVar5 & 1U) == 0) {
    pcVar7 = Minisat::StringOption::operator_cast_to_char_(this_00);
    sVar8 = strlen(pcVar7);
    if (sVar8 == 0) goto LAB_0010aeab;
  }
  pcVar7 = Minisat::StringOption::operator_cast_to_char_(this_00);
  sVar8 = strlen(pcVar7);
  if (sVar8 == 0) {
    local_1868 = _stdout;
  }
  else {
    pcVar7 = Minisat::StringOption::operator_cast_to_char_(this_00);
    local_1868 = fopen(pcVar7,"wb");
  }
  local_1758 = local_1868;
  if (local_1868 == (FILE *)0x0) {
    local_1758 = _stdout;
    pcVar7 = Minisat::StringOption::operator_cast_to_char_(this_00);
    printf("c Error opening %s for write.\n",pcVar7);
  }
  if (local_1758 == _stdout) {
    local_1878 = "stdout";
  }
  else {
    local_1878 = Minisat::StringOption::operator_cast_to_char_(this_00);
  }
  printf("c DRUP proof generation: %s\n",local_1878);
LAB_0010aeab:
  solver = (Solver *)local_1780;
  signal(2,SIGINT_exit);
  signal(0xf,SIGINT_exit);
  signal(0x18,SIGINT_exit);
  piVar6 = Minisat::IntOption::operator_cast_to_int_(local_158);
  if ((*piVar6 != 0x7fffffff) &&
     ((getrlimit(RLIMIT_CPU,&local_1798), local_1798.rlim_max == 0xffffffffffffffff ||
      (piVar6 = Minisat::IntOption::operator_cast_to_int_(local_158),
      (ulong)(long)*piVar6 < local_1798.rlim_max)))) {
    piVar6 = Minisat::IntOption::operator_cast_to_int_(local_158);
    local_1798.rlim_cur = (rlim_t)*piVar6;
    iVar2 = setrlimit(RLIMIT_CPU,&local_1798);
    if (iVar2 == -1) {
      printf("c WARNING! Could not set resource limit: CPU-time.\n");
    }
  }
  piVar6 = Minisat::IntOption::operator_cast_to_int_(&local_1a0);
  if (*piVar6 != 0x7fffffff) {
    piVar6 = Minisat::IntOption::operator_cast_to_int_(&local_1a0);
    local_17a0 = (long)*piVar6 << 0x14;
    getrlimit(RLIMIT_AS,&local_17b0);
    if ((local_17b0.rlim_max == 0xffffffffffffffff) || (local_17a0 < local_17b0.rlim_max)) {
      local_17b0.rlim_cur = local_17a0;
      iVar2 = setrlimit(RLIMIT_AS,&local_17b0);
      if (iVar2 == -1) {
        printf("c WARNING! Could not set resource limit: Virtual memory.\n");
      }
    }
  }
  if (local_8[0] == 1) {
    printf("c Reading from standard input... Use \'--help\' for help.\n");
  }
  if (local_8[0] == 1) {
    local_18b8 = _stdin;
  }
  else {
    local_18b8 = (FILE *)Minisat::open_to_read_file((char *)this);
  }
  local_17b8 = local_18b8;
  if (local_18b8 == (FILE *)0x0) {
    if (local_8[0] == 1) {
      local_18c8 = "<stdin>";
    }
    else {
      local_18c8 = local_10[1];
    }
    printf("c ERROR! Could not open file: %s\n",local_18c8);
    exit(1);
  }
  if (0 < local_174c) {
    printf("c ============================[ Problem Statistics ]=============================\n");
    printf("c |                                                                             |\n");
  }
  Minisat::parse_DIMACS<Minisat::SimpSolver>(in_stack_000fe660,in_stack_000fe658);
  fclose(local_17b8);
  if (local_8[0] < 3) {
    local_18d8 = (FILE *)0x0;
  }
  else {
    local_18d8 = fopen(local_10[2],"wb");
  }
  local_17c0 = local_18d8;
  if (0 < local_174c) {
    uVar3 = Minisat::Solver::nVars((Solver *)0x10b21b);
    printf("c |  Number of variables:  %12d                                         |\n",
           (ulong)uVar3);
    uVar3 = Minisat::Solver::nClauses((Solver *)0x10b248);
    printf("c |  Number of clauses:    %12d                                         |\n",
           (ulong)uVar3);
  }
  local_17c8 = Minisat::cpuTime();
  if (0 < local_174c) {
    printf("c |  Parse time:           %12.2f s                                       |\n",
           local_17c8 - local_1788);
  }
  signal(2,default_signal_handler);
  signal(0xf,default_signal_handler);
  signal(0x18,default_signal_handler);
  signal(0xb,default_signal_handler);
  local_387 = 0;
  Minisat::SimpSolver::eliminate(SUB81(local_1780,0));
  local_17d0 = Minisat::cpuTime();
  if (0 < local_174c) {
    printf("c |  Simplification time:  %12.2f s                                       |\n",
           local_17d0 - local_17c8);
    printf("c |                                                                             |\n");
  }
  bVar1 = Minisat::Solver::okay((Solver *)local_1780);
  if (bVar1) {
    pcVar7 = Minisat::StringOption::operator_cast_to_char_(this_00);
    if (pcVar7 == (char *)0x0) {
      Minisat::vec<Minisat::Lit>::vec(&local_17f0);
      local_17f1 = Minisat::SimpSolver::solveLimited
                             ((SimpSolver *)
                              CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658),
                              (vec<Minisat::Lit> *)this_00,SUB81((ulong)this >> 0x38,0),
                              SUB81((ulong)this >> 0x30,0));
      if (0 < local_174c) {
        printStats((Solver *)0x10b5d8);
        printf("\n");
      }
      Minisat::lbool::lbool(&local_17f2,'\0');
      bVar1 = Minisat::lbool::operator==(&local_17f1,local_17f2);
      if (bVar1) {
        pcVar7 = "s SATISFIABLE\n";
      }
      else {
        Minisat::lbool::lbool(&local_17f3,'\x01');
        bVar1 = Minisat::lbool::operator==(&local_17f1,local_17f3);
        pcVar7 = "s UNKNOWN\n";
        if (bVar1) {
          pcVar7 = "s UNSATISFIABLE\n";
        }
      }
      printf(pcVar7);
      Minisat::lbool::lbool(&local_17f4,'\0');
      bVar1 = Minisat::lbool::operator==(&local_17f1,local_17f4);
      local_1923 = 0;
      if (bVar1) {
        pbVar5 = Minisat::BoolOption::operator_cast_to_bool_(&local_d8);
        local_1923 = *pbVar5;
      }
      if ((local_1923 & 1) != 0) {
        printf("v ");
        local_17f8 = 0;
        while (iVar2 = local_17f8, iVar4 = Minisat::Solver::nVars((Solver *)0x10b77a), iVar2 < iVar4
              ) {
          Minisat::vec<Minisat::lbool>::operator[](local_1778,local_17f8);
          Minisat::lbool::lbool(&local_17f9,'\x02');
          bVar1 = Minisat::lbool::operator!=(this,(lbool)(uint8_t)((ulong)this_00 >> 0x38));
          if (bVar1) {
            pcVar7 = " ";
            if (local_17f8 == 0) {
              pcVar7 = "";
            }
            plVar9 = Minisat::vec<Minisat::lbool>::operator[](local_1778,local_17f8);
            Minisat::lbool::lbool(&local_17fa,'\0');
            bVar1 = Minisat::lbool::operator==(plVar9,local_17fa);
            pcVar10 = "-";
            if (bVar1) {
              pcVar10 = "";
            }
            printf("%s%s%d",pcVar7,pcVar10,(ulong)(local_17f8 + 1));
          }
          local_17f8 = local_17f8 + 1;
        }
        printf(" 0\n");
      }
      bVar1 = false;
      if (local_1758 != (FILE *)0x0) {
        Minisat::lbool::lbool(&local_17fb,'\x01');
        bVar1 = Minisat::lbool::operator==(&local_17f1,local_17fb);
      }
      if (bVar1 != false) {
        fputc(0x61,local_1758);
        fputc(0,local_1758);
      }
      if ((local_1758 != (FILE *)0x0) && (local_1758 != _stdout)) {
        fclose(local_1758);
      }
      if (local_17c0 != (FILE *)0x0) {
        Minisat::lbool::lbool(&local_17fc,'\0');
        bVar1 = Minisat::lbool::operator==(&local_17f1,local_17fc);
        if (bVar1) {
          fprintf(local_17c0,"s SATISFIABLE\nv ");
          local_1800 = 0;
          while (iVar2 = local_1800, iVar4 = Minisat::Solver::nVars((Solver *)0x10b9d9),
                iVar2 < iVar4) {
            Minisat::vec<Minisat::lbool>::operator[](local_1778,local_1800);
            Minisat::lbool::lbool(&local_1801,'\x02');
            bVar1 = Minisat::lbool::operator!=(this,(lbool)(uint8_t)((ulong)this_00 >> 0x38));
            if (bVar1) {
              pcVar7 = " ";
              if (local_1800 == 0) {
                pcVar7 = "";
              }
              __stream = local_17c0;
              plVar9 = Minisat::vec<Minisat::lbool>::operator[](local_1778,local_1800);
              Minisat::lbool::lbool(&local_1802,'\0');
              bVar1 = Minisat::lbool::operator==(plVar9,local_1802);
              pcVar10 = "-";
              if (bVar1) {
                pcVar10 = "";
              }
              fprintf(__stream,"%s%s%d",pcVar7,pcVar10,(ulong)(local_1800 + 1));
            }
            local_1800 = local_1800 + 1;
          }
          fprintf(local_17c0," 0\n");
        }
        else {
          Minisat::lbool::lbool(&local_1803,'\x01');
          bVar1 = Minisat::lbool::operator==(&local_17f1,local_1803);
          if (bVar1) {
            fprintf(local_17c0,"s UNSATISFIABLE\n");
          }
          else {
            fprintf(local_17c0,"s UNKNOWN\n");
          }
        }
        fclose(local_17c0);
      }
      Minisat::lbool::lbool(&local_1804,'\0');
      bVar1 = Minisat::lbool::operator==(&local_17f1,local_1804);
      if (bVar1) {
        iVar2 = 10;
      }
      else {
        Minisat::lbool::lbool(&local_1805,'\x01');
        bVar1 = Minisat::lbool::operator==(&local_17f1,local_1805);
        iVar2 = 0;
        if (bVar1) {
          iVar2 = 0x14;
        }
      }
      exit(iVar2);
    }
    if (0 < local_174c) {
      printf("c ==============================[ Writing DIMACS ]===============================\n");
    }
    Minisat::StringOption::operator_cast_to_char_(this_00);
    Minisat::Solver::toDimacs((Solver *)in_stack_ffffffffffffe680,(char *)in_stack_ffffffffffffe678)
    ;
    if (0 < local_174c) {
      printStats((Solver *)0x10b574);
    }
    exit(0);
  }
  if (local_17c0 != (FILE *)0x0) {
    fprintf(local_17c0,"s UNSATISFIABLE\n");
    fclose(local_17c0);
  }
  if (0 < local_174c) {
    printf("c ===============================================================================\n");
    printf("c Solved by simplification\n");
    printStats((Solver *)0x10b41d);
    printf("\n");
  }
  printf("s UNSATISFIABLE\n");
  if (local_1758 != (FILE *)0x0) {
    Minisat::vec<Minisat::Lit>::vec(&local_17e0);
    Minisat::Solver::binDRUP<Minisat::vec<Minisat::Lit>>
              (in_stack_ffffffffffffe670,in_stack_ffffffffffffe66f,
               (vec<Minisat::Lit> *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
               (FILE *)CONCAT44(in_stack_ffffffffffffe65c,in_stack_ffffffffffffe658));
    Minisat::vec<Minisat::Lit>::~vec((vec<Minisat::Lit> *)0x10b48c);
  }
  if ((local_1758 != (FILE *)0x0) && (local_1758 != _stdout)) {
    fclose(local_1758);
  }
  exit(0x14);
}

Assistant:

int main(int argc, char **argv)
{
    try {
        setUsageHelp("USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or "
                     "gzipped DIMACS.\n");
        printf("c This is MergeSAT (simp).\n");

#if defined(__linux__)
        fpu_control_t oldcw, newcw;
        _FPU_GETCW(oldcw);
        newcw = (oldcw & ~_FPU_EXTENDED) | _FPU_DOUBLE;
        _FPU_SETCW(newcw);
        printf("c WARNING: for repeatability, setting FPU to use double precision\n");
#endif
        // Extra options:
        //
        IntOption verb("MAIN", "verb", "Verbosity level (0=silent, 1=some, 2=more).", 1, IntRange(0, 4), false);
        BoolOption pre("MAIN", "pre", "Completely turn on/off any preprocessing.", true);
        BoolOption s_model("MAIN", "model", "Do report a model if the formula is satisfiable.", true, false);
        StringOption dimacs("MAIN", "dimacs", "If given, stop after preprocessing and write the result to this file.");
        IntOption cpu_lim("MAIN", "cpu-lim", "Limit on CPU time allowed in seconds.\n", INT32_MAX, IntRange(0, INT32_MAX), false);
        IntOption mem_lim("MAIN", "mem-lim", "Limit on memory usage in megabytes.\n", INT32_MAX, IntRange(0, INT32_MAX), false);
        BoolOption drup("MAIN", "drup", "Generate DRUP UNSAT proof.", false, false);
        StringOption drup_file("MAIN", "drup-file", "DRUP UNSAT proof ouput file.", "");
        StringOption pcs_file("MAIN", "pcs-file", "Print solver parameter configuration to this file.", "");

        parseOptions(argc, argv, true);

        if (!pcs_file.is_empty()) print_pcs_file(pcs_file);

        SimpSolver S;
        double initial_time = cpuTime();

        if (!pre) S.eliminate(true);

        S.parsing = true;
        S.verbosity = verb;
        S.drup_file = NULL;
        if (drup || strlen(drup_file)) {
            S.drup_file = strlen(drup_file) ? fopen(drup_file, "wb") : stdout;
            if (S.drup_file == NULL) {
                S.drup_file = stdout;
                printf("c Error opening %s for write.\n", (const char *)drup_file);
            }
            printf("c DRUP proof generation: %s\n", S.drup_file == stdout ? "stdout" : drup_file);
        }

        solver = &S;
        // Use signal handlers that forcibly quit until the solver will be able to respond to
        // interrupts:
        signal(SIGINT, SIGINT_exit);
        signal(SIGTERM, SIGINT_exit);
        signal(SIGXCPU, SIGINT_exit);

        // Set limit on CPU-time:
        if (cpu_lim != INT32_MAX) {
            rlimit rl;
            getrlimit(RLIMIT_CPU, &rl);
            if (rl.rlim_max == RLIM_INFINITY || (rlim_t)cpu_lim < rl.rlim_max) {
                rl.rlim_cur = cpu_lim;
                if (setrlimit(RLIMIT_CPU, &rl) == -1) printf("c WARNING! Could not set resource limit: CPU-time.\n");
            }
        }

        // Set limit on virtual memory:
        if (mem_lim != INT32_MAX) {
            rlim_t new_mem_lim = (rlim_t)mem_lim * 1024 * 1024;
            rlimit rl;
            getrlimit(RLIMIT_AS, &rl);
            if (rl.rlim_max == RLIM_INFINITY || new_mem_lim < rl.rlim_max) {
                rl.rlim_cur = new_mem_lim;
                if (setrlimit(RLIMIT_AS, &rl) == -1)
                    printf("c WARNING! Could not set resource limit: Virtual memory.\n");
            }
        }

        if (argc == 1) printf("c Reading from standard input... Use '--help' for help.\n");

#ifdef USE_LIBZ
        gzFile in = (argc == 1) ? gzdopen(0, "rb") : gzopen(argv[1], "rb");
#else
        FILE *in = (argc == 1) ? stdin : open_to_read_file(argv[1]);
#endif
        if (in == NULL) printf("c ERROR! Could not open file: %s\n", argc == 1 ? "<stdin>" : argv[1]), exit(1);

        if (S.verbosity > 0) {
            printf("c ============================[ Problem Statistics ]=============================\n");
            printf("c |                                                                             |\n");
        }

        parse_DIMACS(in, S);
        fclose(in);
        FILE *res = (argc >= 3) ? fopen(argv[2], "wb") : NULL;

        if (S.verbosity > 0) {
            printf("c |  Number of variables:  %12d                                         |\n", S.nVars());
            printf("c |  Number of clauses:    %12d                                         |\n", S.nClauses());
        }

        double parsed_time = cpuTime();
        if (S.verbosity > 0)
            printf("c |  Parse time:           %12.2f s                                       |\n", parsed_time - initial_time);

        // Change to signal-handlers that will only notify the solver and allow it to terminate
        // voluntarily:
        signal(SIGINT, default_signal_handler);
        signal(SIGTERM, default_signal_handler);
        signal(SIGXCPU, default_signal_handler);
        signal(SIGSEGV, default_signal_handler); /* we still want to understand the state */

        S.parsing = false;
        S.eliminate(true);
        double simplified_time = cpuTime();
        if (S.verbosity > 0) {
            printf("c |  Simplification time:  %12.2f s                                       |\n", simplified_time - parsed_time);
            printf("c |                                                                             |\n");
        }

        if (!S.okay()) {
            if (res != NULL) fprintf(res, "s UNSATISFIABLE\n"), fclose(res);
            if (S.verbosity > 0) {
                printf("c ===============================================================================\n");
                printf("c Solved by simplification\n");
                printStats(S);
                printf("\n");
            }
            printf("s UNSATISFIABLE\n");
            if (S.drup_file) {
#ifdef BIN_DRUP
                S.binDRUP('a', vec<Lit>(), S.drup_file);
#else
                fprintf(S.drup_file, "0\n");
#endif
            }
            if (S.drup_file && S.drup_file != stdout) fclose(S.drup_file);
            exit(20);
        }

        if (dimacs) {
            if (S.verbosity > 0)
                printf("c ==============================[ Writing DIMACS ]===============================\n");
            S.toDimacs((const char *)dimacs);
            if (S.verbosity > 0) printStats(S);
            exit(0);
        }

        vec<Lit> dummy;
        lbool ret = S.solveLimited(dummy);

        if (S.verbosity > 0) {
            printStats(S);
            printf("\n");
        }
        printf(ret == l_True ? "s SATISFIABLE\n" : ret == l_False ? "s UNSATISFIABLE\n" : "s UNKNOWN\n");
        if (ret == l_True && s_model) {
            printf("v ");
            for (int i = 0; i < S.nVars(); i++)
                if (S.model[i] != l_Undef)
                    printf("%s%s%d", (i == 0) ? "" : " ", (S.model[i] == l_True) ? "" : "-", i + 1);
            printf(" 0\n");
        }


        if (S.drup_file && ret == l_False) {
#ifdef BIN_DRUP
            fputc('a', S.drup_file);
            fputc(0, S.drup_file);
#else
            fprintf(S.drup_file, "0\n");
#endif
        }
        if (S.drup_file && S.drup_file != stdout) fclose(S.drup_file);

        if (res != NULL) {
            if (ret == l_True) {
                fprintf(res, "s SATISFIABLE\nv ");
                for (int i = 0; i < S.nVars(); i++)
                    if (S.model[i] != l_Undef)
                        fprintf(res, "%s%s%d", (i == 0) ? "" : " ", (S.model[i] == l_True) ? "" : "-", i + 1);
                fprintf(res, " 0\n");
            } else if (ret == l_False)
                fprintf(res, "s UNSATISFIABLE\n");
            else
                fprintf(res, "s UNKNOWN\n");
            fclose(res);
        }

#ifdef NDEBUG
        exit(ret == l_True ? 10 : ret == l_False ? 20 : 0); // (faster than "return", which will invoke the destructor for 'Solver')
#else
        return (ret == l_True ? 10 : ret == l_False ? 20 : 0);
#endif
    } catch (OutOfMemoryException &) {
        printf("c ===============================================================================\n");
        printf("c Out of memory\n");
        printf("s UNKNOWN\n");
        exit(0);
    }
}